

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_dup(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t options,ly_bool nosiblings,
              lyd_node **dup_p)

{
  lyd_node *plVar1;
  lyd_node *local_88;
  uint32_t local_7c;
  lyd_node *plStack_78;
  uint32_t insert_order;
  lyd_node *first_llist;
  lyd_node *first_sibling;
  lyd_node *dup;
  lyd_node *local_parent;
  lyd_node *top;
  lyd_node *first_dup;
  lyd_node *orig;
  lyd_node **pplStack_38;
  LY_ERR rc;
  lyd_node **dup_p_local;
  ly_bool nosiblings_local;
  lyd_node *plStack_28;
  uint32_t options_local;
  lyd_node *parent_local;
  ly_ctx *trg_ctx_local;
  lyd_node *node_local;
  
  top = (lyd_node *)0x0;
  local_parent = (lyd_node *)0x0;
  dup = (lyd_node *)0x0;
  first_sibling = (lyd_node *)0x0;
  first_llist = (lyd_node *)0x0;
  plStack_78 = (lyd_node *)0x0;
  pplStack_38 = dup_p;
  dup_p_local._3_1_ = nosiblings;
  dup_p_local._4_4_ = options;
  plStack_28 = parent;
  parent_local = (lyd_node *)trg_ctx;
  trg_ctx_local = (ly_ctx *)node;
  if ((node == (lyd_node *)0x0) || (trg_ctx == (ly_ctx *)0x0)) {
    __assert_fail("node && trg_ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x8e1,
                  "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                 );
  }
  plVar1 = parent;
  if ((options & 4) != 0) {
    orig._4_4_ = lyd_dup_get_local_parent(node,trg_ctx,parent,options & 10,&local_parent,&dup);
    if (orig._4_4_ != LY_SUCCESS) {
LAB_0012eed8:
      if (local_parent == (lyd_node *)0x0) {
        if (top == (lyd_node *)0x0) {
          lyd_free_siblings(first_sibling);
        }
        else {
          lyd_free_siblings(top);
        }
      }
      else {
        lyd_free_tree(local_parent);
      }
      return orig._4_4_;
    }
    orig._4_4_ = 0;
    plVar1 = dup;
  }
  dup = plVar1;
  for (first_dup = (lyd_node *)trg_ctx_local; first_dup != (lyd_node *)0x0;
      first_dup = first_dup->next) {
    if (((first_dup->schema == (lysc_node *)0x0) || (first_dup->schema->nodetype != 4)) ||
       ((first_dup->schema->flags & 0x100) == 0)) {
      local_7c = 0;
      if ((dup_p_local._4_4_ & 0x40) != 0) {
        local_7c = 2;
      }
      if (plStack_78 == (lyd_node *)0x0) {
        if ((first_dup->schema != (lysc_node *)0x0) && ((first_dup->schema->nodetype & 0x18) != 0))
        {
          plStack_78 = first_dup;
        }
      }
      else if (first_dup->schema == plStack_78->schema) {
        local_7c = 1;
      }
      else {
        plStack_78 = (lyd_node *)0x0;
      }
      orig._4_4_ = lyd_dup_r(first_dup,(ly_ctx *)parent_local,dup,local_7c,&first_llist,
                             dup_p_local._4_4_,&first_sibling);
      if (orig._4_4_ != LY_SUCCESS) goto LAB_0012eed8;
      if ((plStack_78 != (lyd_node *)0x0) && (first_sibling->next != (lyd_node *)0x0)) {
        plStack_78 = (lyd_node *)0x0;
      }
    }
    else if (dup == (lyd_node *)0x0) {
      if ((dup_p_local._4_4_ & 4) != 0) {
        __assert_fail("!(options & LYD_DUP_WITH_PARENTS)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0x8f1,
                      "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                     );
      }
      orig._4_4_ = lyd_dup_r(first_dup,(ly_ctx *)parent_local,(lyd_node *)0x0,0,&first_llist,
                             dup_p_local._4_4_,&first_sibling);
      if (orig._4_4_ != LY_SUCCESS) goto LAB_0012eed8;
    }
    else {
      plVar1 = lyd_child(dup);
      orig._4_4_ = lyd_find_sibling_schema(plVar1,first_dup->schema,&first_sibling);
      if (orig._4_4_ != LY_SUCCESS) {
        ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c",
               0x8ef);
        goto LAB_0012eed8;
      }
    }
    orig._4_4_ = 0;
    if (top == (lyd_node *)0x0) {
      local_88 = first_sibling;
    }
    else {
      local_88 = top;
    }
    top = local_88;
    if (dup_p_local._3_1_ != '\0') break;
  }
  if (pplStack_38 != (lyd_node **)0x0) {
    *pplStack_38 = top;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_dup(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t options,
        ly_bool nosiblings, struct lyd_node **dup_p)
{
    LY_ERR rc;
    const struct lyd_node *orig;            /* original node to be duplicated */
    struct lyd_node *first_dup = NULL;      /* the first duplicated node, this is returned */
    struct lyd_node *top = NULL;            /* the most higher created node */
    struct lyd_node *local_parent = NULL;   /* the direct parent node for the duplicated node(s) */
    struct lyd_node *dup = NULL;            /* duplicate node */
    struct lyd_node *first_sibling = NULL;  /* first sibling node */
    const struct lyd_node *first_llist = NULL;  /* first duplicated (leaf-)list node, if any */
    uint32_t insert_order;

    assert(node && trg_ctx);

    if (options & LYD_DUP_WITH_PARENTS) {
        LY_CHECK_GOTO(rc = lyd_dup_get_local_parent(node, trg_ctx, parent, options & (LYD_DUP_WITH_FLAGS | LYD_DUP_NO_META),
                &top, &local_parent), error);
    } else {
        local_parent = parent;
    }

    LY_LIST_FOR(node, orig) {
        if (lysc_is_key(orig->schema)) {
            if (local_parent) {
                /* the key must already exist in the parent */
                rc = lyd_find_sibling_schema(lyd_child(local_parent), orig->schema, &dup);
                LY_CHECK_ERR_GOTO(rc, LOGINT(trg_ctx), error);
            } else {
                assert(!(options & LYD_DUP_WITH_PARENTS));
                /* duplicating a single key, okay, I suppose... */
                rc = lyd_dup_r(orig, trg_ctx, NULL, LYD_INSERT_NODE_DEFAULT, &first_sibling, options, &dup);
                LY_CHECK_GOTO(rc, error);
            }
        } else {
            /* decide insert order */
            insert_order = (options & LYD_DUP_NO_LYDS) ? LYD_INSERT_NODE_LAST_BY_SCHEMA : LYD_INSERT_NODE_DEFAULT;
            if (first_llist) {
                if (orig->schema != first_llist->schema) {
                    /* all the (leaf-)list instances duplicated */
                    first_llist = NULL;
                } else {
                    /* duplicating all the instances of a (leaf-)list, no need to change their order */
                    insert_order = LYD_INSERT_NODE_LAST;
                }
            } else if (orig->schema && (orig->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
                /* duplicating the first (leaf-)list instance, duplicate the rest more efficiently */
                first_llist = orig;
            }

            /* duplicate the node */
            rc = lyd_dup_r(orig, trg_ctx, local_parent, insert_order, &first_sibling, options, &dup);
            LY_CHECK_GOTO(rc, error);

            if (first_llist && dup->next) {
                /* orig was not the last node (because we are inserting into a parent with some previous instances),
                 * we must check find the order */
                first_llist = NULL;
            }
        }
        first_dup = first_dup ? first_dup : dup;

        if (nosiblings) {
            break;
        }
    }

    if (dup_p) {
        *dup_p = first_dup;
    }
    return LY_SUCCESS;

error:
    if (top) {
        lyd_free_tree(top);
    } else if (first_dup) {
        lyd_free_siblings(first_dup);
    } else {
        lyd_free_siblings(dup);
    }
    return rc;
}